

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_tables(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  ulong __new_size;
  bool bVar2;
  w3TableType wVar3;
  string sStack_48;
  
  uVar1 = read_varuint32(this,cursor);
  __new_size = (ulong)uVar1;
  printf("reading tables size:%lX\n",__new_size);
  if (uVar1 != 1) {
    StringFormat_abi_cxx11_(&sStack_48,"%lX",__new_size);
    AssertFailedFormat("size == 1",&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  std::vector<w3TableType,_std::allocator<w3TableType>_>::resize(&this->tables,__new_size);
  while (bVar2 = __new_size != 0, __new_size = __new_size - 1, bVar2) {
    wVar3 = read_tabletype(this,cursor);
    *(this->tables).super__Vector_base<w3TableType,_std::allocator<w3TableType>_>._M_impl.
     super__Vector_impl_data._M_start = wVar3;
  }
  return;
}

Assistant:

void w3Module::read_tables (uint8_t** cursor)
{
    const size_t size = read_varuint32 (cursor);
    printf ("reading tables size:%" FORMAT_SIZE "X\n", size);
    AssertFormat (size == 1, ("%" FORMAT_SIZE "X", size));
    tables.resize (size);
    for (size_t i = 0; i < size; ++i)
        tables [0] = read_tabletype (cursor);
}